

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_string<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  element_type *peVar1;
  char_type_conflict cVar2;
  ulong uVar3;
  ulong uVar4;
  location first;
  source_location src;
  allocator<char> local_25a;
  allocator<char> local_259;
  string local_258;
  string local_238;
  location local_218;
  undefined1 local_1d0 [104];
  source_location local_168;
  source_location local_f0;
  error_info local_78;
  
  location::location(&local_218,loc);
  peVar1 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar3 = loc->location_;
  uVar4 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar3 < uVar4) {
    cVar2 = location::current(loc);
    if (cVar2 == '\"') {
      local_1d0._0_8_ = &PTR__scanner_base_004cc9f8;
      local_1d0._8_8_ = "\"\"\"";
      local_1d0._16_8_ = (pointer)0x3;
      literal::scan((region *)&local_168,(literal *)local_1d0,loc);
      region::~region((region *)&local_168);
      if (local_168._0_8_ == 0) {
        location::operator=(loc,&local_218);
        parse_basic_string<toml::type_config>(__return_storage_ptr__,loc,ctx);
      }
      else {
        location::operator=(loc,&local_218);
        parse_ml_basic_string<toml::type_config>(__return_storage_ptr__,loc,ctx);
      }
      goto LAB_00339a67;
    }
    peVar1 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar3 = loc->location_;
    uVar4 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
  }
  if (uVar3 < uVar4) {
    cVar2 = location::current(loc);
    if (cVar2 == '\'') {
      local_1d0._0_8_ = &PTR__scanner_base_004cc9f8;
      local_1d0._8_8_ = "\'\'\'";
      local_1d0._16_8_ = (pointer)0x3;
      literal::scan((region *)&local_168,(literal *)local_1d0,loc);
      region::~region((region *)&local_168);
      if (local_168._0_8_ == 0) {
        location::operator=(loc,&local_218);
        parse_literal_string<toml::type_config>(__return_storage_ptr__,loc,ctx);
      }
      else {
        location::operator=(loc,&local_218);
        parse_ml_literal_string<toml::type_config>(__return_storage_ptr__,loc,ctx);
      }
      goto LAB_00339a67;
    }
  }
  region::region((region *)local_1d0,loc);
  source_location::source_location(&local_168,(region *)local_1d0);
  region::~region((region *)local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"toml::parse_string: not a string",&local_259);
  source_location::source_location(&local_f0,&local_168);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"here",&local_25a);
  make_error_info<>((error_info *)local_1d0,&local_238,&local_f0,&local_258);
  err<toml::error_info>((failure<toml::error_info> *)&local_78,(error_info *)local_1d0);
  result<toml::basic_value<toml::type_config>,_toml::error_info>::result
            (__return_storage_ptr__,(failure_type *)&local_78);
  error_info::~error_info(&local_78);
  error_info::~error_info((error_info *)local_1d0);
  std::__cxx11::string::~string((string *)&local_258);
  source_location::~source_location(&local_f0);
  std::__cxx11::string::~string((string *)&local_238);
  source_location::~source_location(&local_168);
LAB_00339a67:
  location::~location(&local_218);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_string(location& loc, const context<TC>& ctx)
{
    const auto first = loc;

    if( ! loc.eof() && loc.current() == '"')
    {
        if(literal("\"\"\"").scan(loc).is_ok())
        {
            loc = first;
            return parse_ml_basic_string(loc, ctx);
        }
        else
        {
            loc = first;
            return parse_basic_string(loc, ctx);
        }
    }
    else if( ! loc.eof() && loc.current() == '\'')
    {
        if(literal("'''").scan(loc).is_ok())
        {
            loc = first;
            return parse_ml_literal_string(loc, ctx);
        }
        else
        {
            loc = first;
            return parse_literal_string(loc, ctx);
        }
    }
    else
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_string: "
            "not a string", std::move(src), "here"));
    }
}